

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O2

int Scl_CommandPrintLib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *__s;
  char *pcVar3;
  uint fShort;
  size_t __size;
  uint fInvOnly;
  char *pcVar4;
  float fVar5;
  double dVar6;
  float local_38;
  float local_34;
  
  fInvOnly = 0;
  Extra_UtilGetoptReset();
  local_34 = 100.0;
  local_38 = 0.0;
  fShort = 0;
LAB_003a67eb:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"SGish"), iVar1 = globalUtilOptind, iVar2 == 0x73) {
      fShort = fShort ^ 1;
    }
    if (iVar2 == -1) {
      if ((SC_Lib *)pAbc->pLibScl != (SC_Lib *)0x0) {
        Abc_SclPrintCells((SC_Lib *)pAbc->pLibScl,local_38,local_34,fInvOnly,fShort);
        return 0;
      }
      __s = (FILE *)pAbc->Err;
      pcVar3 = "There is no Liberty library available.\n";
      __size = 0x27;
      goto LAB_003a69e2;
    }
    if (iVar2 == 0x47) {
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-G\" should be followed by a floating point number.\n";
LAB_003a690d:
        Abc_Print(-1,pcVar3);
        goto LAB_003a6917;
      }
      dVar6 = atof(argv[globalUtilOptind]);
      fVar5 = (float)dVar6;
      local_34 = fVar5;
    }
    else {
      if (iVar2 == 0x69) {
        fInvOnly = fInvOnly ^ 1;
        goto LAB_003a67eb;
      }
      if (iVar2 != 0x53) goto LAB_003a6917;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-S\" should be followed by a floating point number.\n";
        goto LAB_003a690d;
      }
      dVar6 = atof(argv[globalUtilOptind]);
      fVar5 = (float)dVar6;
      local_38 = fVar5;
    }
    globalUtilOptind = iVar1 + 1;
    if (fVar5 <= 0.0) {
LAB_003a6917:
      fwrite("usage: print_lib [-SG float] [-ish]\n",0x24,1,(FILE *)pAbc->Err);
      fwrite("\t           prints statistics of Liberty library\n",0x31,1,(FILE *)pAbc->Err);
      fprintf((FILE *)pAbc->Err,
              "\t-S float : the slew parameter used to generate the library [default = %.2f]\n",
              (double)local_38);
      fprintf((FILE *)pAbc->Err,
              "\t-G float : the gain parameter used to generate the library [default = %.2f]\n",
              (double)local_34);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (fInvOnly == 0) {
        pcVar3 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-i       : toggle printing invs/bufs only [default = %s]\n",
              pcVar3);
      if (fShort == 0) {
        pcVar4 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-s       : toggle printing in short format [default = %s]\n",
              pcVar4);
      __s = (FILE *)pAbc->Err;
      pcVar3 = "\t-h       : print the help massage\n";
      __size = 0x23;
LAB_003a69e2:
      fwrite(pcVar3,__size,1,__s);
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandPrintLib( Abc_Frame_t * pAbc, int argc, char **argv )
{
    float Slew = 0; // use library
    float Gain = 100;
    int fInvOnly = 0;
    int fShort = 0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SGish" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'i':
            fInvOnly ^= 1;
            break;
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }

    // save current library
    Abc_SclPrintCells( (SC_Lib *)pAbc->pLibScl, Slew, Gain, fInvOnly, fShort );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: print_lib [-SG float] [-ish]\n" );
    fprintf( pAbc->Err, "\t           prints statistics of Liberty library\n" );
    fprintf( pAbc->Err, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    fprintf( pAbc->Err, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    fprintf( pAbc->Err, "\t-i       : toggle printing invs/bufs only [default = %s]\n", fInvOnly? "yes": "no" );
    fprintf( pAbc->Err, "\t-s       : toggle printing in short format [default = %s]\n", fShort? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the help massage\n" );
    return 1;
}